

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOLoader.cpp
# Opt level: O1

void __thiscall
Assimp::LWOImporter::DoRecursiveVMAPAssignment
          (LWOImporter *this,VMapEntry *base,uint numRead,uint idx,float *data)

{
  ulong *puVar1;
  uint uVar2;
  _Bit_type *p_Var3;
  Layer *pLVar4;
  ulong uVar5;
  runtime_error *this_00;
  ulong uVar6;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  uVar5 = (ulong)idx;
  while( true ) {
    if (data == (float *)0x0) {
      __assert_fail("__null != data",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/LWO/LWOLoader.cpp"
                    ,0x3bf,
                    "void Assimp::LWOImporter::DoRecursiveVMAPAssignment(VMapEntry *, unsigned int, unsigned int, float *)"
                   );
    }
    p_Var3 = (base->abAssigned).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    if ((ulong)(base->abAssigned).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset +
        ((long)(base->abAssigned).super__Bvector_base<std::allocator<bool>_>._M_impl.
               super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p - (long)p_Var3) * 8
        <= uVar5) break;
    pLVar4 = this->mCurLayer;
    puVar1 = p_Var3 + (uVar5 >> 6);
    *puVar1 = *puVar1 | 1L << ((byte)uVar5 & 0x3f);
    if (numRead != 0) {
      uVar6 = 0;
      do {
        (base->rawData).super__Vector_base<float,_std::allocator<float>_>._M_impl.
        super__Vector_impl_data._M_start[base->dims * (int)uVar5 + (int)uVar6] = data[uVar6];
        uVar6 = uVar6 + 1;
      } while (numRead != uVar6);
    }
    uVar2 = (pLVar4->mPointReferrers).
            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar5];
    uVar5 = (ulong)uVar2;
    if (uVar2 == 0xffffffff) {
      return;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"Bad index","");
  std::runtime_error::runtime_error(this_00,(string *)local_40);
  *(undefined ***)this_00 = &PTR__runtime_error_00896c98;
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline void LWOImporter::DoRecursiveVMAPAssignment(VMapEntry* base, unsigned int numRead,
    unsigned int idx, float* data)
{
    ai_assert(NULL != data);
    LWO::ReferrerList& refList  = mCurLayer->mPointReferrers;
    unsigned int i;

    if (idx >= base->abAssigned.size()) {
        throw DeadlyImportError("Bad index");
    }
    base->abAssigned[idx] = true;
    for (i = 0; i < numRead;++i) {
        base->rawData[idx*base->dims+i]= data[i];
    }

    if (UINT_MAX != (i = refList[idx])) {
        DoRecursiveVMAPAssignment(base,numRead,i,data);
    }
}